

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale.cpp
# Opt level: O2

string * fs_to_narrow_abi_cxx11_(string *__return_storage_ptr__,wstring_view w)

{
  string_view fname;
  error_code local_18;
  
  if (w._M_len != 0) {
    local_18._M_cat = (error_category *)std::_V2::generic_category();
    local_18._M_value = 0x26;
    fname._M_str = "fs_to_narrow";
    fname._M_len = 0xc;
    fs_print_error((string_view)(ZEXT816(0x1186dc) << 0x40),fname,&local_18);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string fs_to_narrow(std::wstring_view w)
{
  if(w.empty())
    return {};

  // https://learn.microsoft.com/en-us/windows/win32/api/stringapiset/nf-stringapiset-widechartomultibyte
#if defined(ffilesystem_HAVE_CODECVT)
  // deprecated in C++17, but no STL replacement
  std::wstring_convert<std::codecvt_utf8<wchar_t>> converter;
  return converter.to_bytes(w.data());
#else
  fs_print_error("", __func__, std::make_error_code(std::errc::function_not_supported));
  return {};
#endif

}